

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FieldDescriptor * __thiscall
google::protobuf::FileDescriptor::FindExtensionByName(FileDescriptor *this,string *key)

{
  __node_ptr p_Var1;
  char *pcVar2;
  int *piVar3;
  ulong uVar4;
  FieldDescriptor *pFVar5;
  char cVar6;
  int *piVar7;
  key_type local_18;
  
  local_18.second = (key->_M_dataplus)._M_p;
  cVar6 = *local_18.second;
  if (cVar6 == '\0') {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    pcVar2 = local_18.second;
    do {
      pcVar2 = pcVar2 + 1;
      uVar4 = (long)cVar6 + uVar4 * 5;
      cVar6 = *pcVar2;
    } while (cVar6 != '\0');
  }
  uVar4 = (long)this * 0x1000193 ^ uVar4;
  local_18.first = this;
  p_Var1 = std::
           _Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(*(_Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            **)(this + 0x90),
                          uVar4 % (*(_Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                     **)(this + 0x90))->_M_bucket_count,&local_18,uVar4);
  piVar3 = (int *)((long)&(p_Var1->
                          super__Hash_node_value<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_true>
                          ).
                          super__Hash_node_value_base<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>
                          ._M_storage._M_storage + 0x10);
  piVar7 = piVar3;
  if (p_Var1 == (__node_ptr)0x0) {
    piVar7 = &(anonymous_namespace)::kNullSymbol;
  }
  if ((*piVar7 == 2) || (pFVar5 = (FieldDescriptor *)0x0, (anonymous_namespace)::kNullSymbol != 0))
  {
    if (p_Var1 == (__node_ptr)0x0) {
      piVar3 = &(anonymous_namespace)::kNullSymbol;
    }
    if (*piVar7 != 2) {
      piVar3 = &(anonymous_namespace)::kNullSymbol;
    }
    pFVar5 = (FieldDescriptor *)0x0;
    if ((*(FieldDescriptor **)(piVar3 + 2))[0x42] != (FieldDescriptor)0x0) {
      pFVar5 = *(FieldDescriptor **)(piVar3 + 2);
    }
  }
  return pFVar5;
}

Assistant:

const FieldDescriptor* FileDescriptor::FindExtensionByName(
    const std::string& key) const {
  Symbol result = tables_->FindNestedSymbolOfType(this, key, Symbol::FIELD);
  if (!result.IsNull() && result.field_descriptor->is_extension()) {
    return result.field_descriptor;
  } else {
    return nullptr;
  }
}